

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDeadline.h
# Opt level: O1

void __thiscall EDeadline::EDeadline(EDeadline *this,string *arg,double expectedTimeForCompletion)

{
  pointer pcVar1;
  long *local_38;
  long local_30;
  long local_28 [2];
  
  pcVar1 = (arg->_M_dataplus)._M_p;
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + arg->_M_string_length);
  (this->super_E)._vptr_E = (_func_int **)&PTR__E_0059bd80;
  (this->super_E)._m_error._M_dataplus._M_p = (pointer)&(this->super_E)._m_error.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_E)._m_error,local_38,local_30 + (long)local_38);
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  (this->super_E)._vptr_E = (_func_int **)&PTR__E_0059ce68;
  this->_m_expectedTimeForCompletion = expectedTimeForCompletion;
  return;
}

Assistant:

EDeadline(std::string arg, double expectedTimeForCompletion=0):
        E(arg),
        _m_expectedTimeForCompletion(expectedTimeForCompletion)
        {}